

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsPublicationSetOption(HelicsPublication pub,int option,int value,HelicsError *err)

{
  HelicsPublication pvVar1;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (pub == (HelicsPublication)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001aa74a;
    }
    else {
      pvVar1 = (HelicsPublication)0x0;
      if (*pub == -0x684eff5b) {
        pvVar1 = pub;
      }
      if (*pub == -0x684eff5b || err == (HelicsError *)0x0) goto LAB_001aa74c;
    }
    err->error_code = -3;
    err->message = "The given publication object does not point to a valid object";
  }
LAB_001aa74a:
  pvVar1 = (HelicsPublication)0x0;
LAB_001aa74c:
  if (pvVar1 != (HelicsPublication)0x0) {
    (**(code **)(**(long **)((long)pvVar1 + 0x18) + 0x10))();
  }
  return;
}

Assistant:

void helicsPublicationSetOption(HelicsPublication pub, int option, int value, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->setOption(option, value);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}